

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PixelToasterUnix.h
# Opt level: O3

void __thiscall PixelToaster::UnixDisplay::defaults(UnixDisplay *this)

{
  char *__ptr;
  
  (this->super_DisplayAdapter)._title[0] = '\0';
  (this->super_DisplayAdapter)._width = 0;
  (this->super_DisplayAdapter)._height = 0;
  (this->super_DisplayAdapter)._mode = FloatingPoint;
  (this->super_DisplayAdapter)._output = Default;
  (this->super_DisplayAdapter)._open = false;
  this->display_ = (Display *)0x0;
  this->window_ = 0;
  this->gc_ = (GC)0x0;
  this->image_ = (XImage *)0x0;
  __ptr = (this->buffer_).data_;
  (this->buffer_).data_ = (char *)0x0;
  if (__ptr != (char *)0x0) {
    free(__ptr);
  }
  this->trueColorConverter_ = (Converter *)0x0;
  this->floatingPointConverter_ = (Converter *)0x0;
  this->isShuttingDown_ = false;
  return;
}

Assistant:

void defaults() override
    {
        DisplayAdapter::defaults();

        display_ = 0;
        window_  = 0;
        gc_      = 0;
        image_   = 0;
        buffer_.reset();
        trueColorConverter_     = 0;
        floatingPointConverter_ = 0;
        isShuttingDown_         = false;
        Format destFormat_      = Format::Unknown;
    }